

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall
spvtools::val::Instruction::RegisterUse(Instruction *this,Instruction *inst,uint32_t index)

{
  pair<const_spvtools::val::Instruction_*,_unsigned_int> local_10;
  
  local_10.first = inst;
  local_10.second = index;
  std::
  vector<std::pair<spvtools::val::Instruction_const*,unsigned_int>,std::allocator<std::pair<spvtools::val::Instruction_const*,unsigned_int>>>
  ::emplace_back<std::pair<spvtools::val::Instruction_const*,unsigned_int>>
            ((vector<std::pair<spvtools::val::Instruction_const*,unsigned_int>,std::allocator<std::pair<spvtools::val::Instruction_const*,unsigned_int>>>
              *)&this->uses_,&local_10);
  return;
}

Assistant:

void Instruction::RegisterUse(const Instruction* inst, uint32_t index) {
  uses_.push_back(std::make_pair(inst, index));
}